

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.cc
# Opt level: O1

int __thiscall Array::subsequence(Array *this,Array_S *ar)

{
  uint uVar1;
  element_type *peVar2;
  element_type *peVar3;
  long lVar4;
  long lVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  Array_S ar2;
  Array_S ar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  local_48 = (element_type *)0x0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = (element_type *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar7 = this->theSize;
  peVar2 = (ar->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = peVar2->theSize;
  if ((int)uVar1 < (int)uVar7) {
    local_48 = peVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (a_Stack_40,&(ar->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Array*>(&_Stack_60,this);
    _Var6._M_pi = _Stack_50._M_pi;
    _Stack_50._M_pi = _Stack_60._M_pi;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58 = this;
    if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
    }
    if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
    }
    iVar9 = -1;
    uVar10 = uVar7;
    uVar7 = uVar1;
  }
  else {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Array*>(&_Stack_60,this);
    _Var6._M_pi = a_Stack_40[0]._M_pi;
    a_Stack_40[0]._M_pi = _Stack_60._M_pi;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48 = this;
    if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
    }
    if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
    }
    local_58 = (ar->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_50,&(ar->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    iVar9 = 1;
    uVar10 = uVar1;
  }
  if (0 < (int)uVar7) {
    uVar11 = 0;
    iVar12 = 0;
    do {
      iVar15 = iVar12;
      if (iVar12 < (int)uVar10) {
        peVar3 = (local_48->theArray).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        lVar4 = (long)(peVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
        if ((ulong)((long)(peVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - lVar4 >> 2) <= uVar11) {
LAB_00116d52:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11);
        }
        peVar3 = (local_58->theArray).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        lVar5 = (long)(peVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
        uVar8 = (long)(peVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - lVar5 >> 2;
        uVar14 = (ulong)iVar12;
        iVar15 = 0;
        uVar13 = uVar14;
        do {
          if (uVar8 <= uVar13) {
            uVar11 = uVar14;
            if (uVar14 < uVar8) {
              uVar11 = uVar8;
            }
            goto LAB_00116d52;
          }
          if (*(int *)(lVar4 + uVar11 * 4) == *(int *)(lVar5 + uVar13 * 4)) {
            iVar15 = iVar12 - iVar15;
            iVar12 = iVar15 + 1;
            goto LAB_00116d08;
          }
          uVar13 = uVar13 + 1;
          iVar15 = iVar15 + -1;
        } while ((long)(int)uVar10 != uVar13);
        iVar15 = iVar12 - iVar15;
      }
LAB_00116d08:
      if (local_58->theSize <= iVar15) {
        iVar9 = 0;
        break;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar7);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
  }
  return iVar9;
}

Assistant:

int Array::subsequence(Array_S ar) {
    int i, j;
    int sz1, sz2;
    Array_S ar1, ar2;
    int retval;

    if (theSize <= ar->theSize) {
        sz1 = theSize;
        sz2 = ar->theSize;
        ar1 = shared_ptr<Array>(this);
        ar2 = ar;
        retval = 1;
    } else {
        sz1 = ar->theSize;
        sz2 = theSize;
        ar1 = ar;
        ar2 = shared_ptr<Array>(this);
        retval = -1;
    }
    int start = 0;
    for (i = 0; i < sz1; i++) {
        for (j = start; j < sz2; j++) {
            if (ar1->theArray->at(i) == ar2->theArray->at(j)) {
                start = j + 1;
                break;
            }
        }
        if (j >= ar2->theSize) return 0;
    }
    return retval;
}